

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O1

int __thiscall Fl_Input::kf_move_eol(Fl_Input *this)

{
  bool bVar1;
  int p;
  int iVar2;
  
  p = Fl_Input_::line_end(&this->super_Fl_Input_,(this->super_Fl_Input_).position_);
  iVar2 = p;
  if (((uint)Fl::e_state >> 0x10 & 1) != 0) {
    iVar2 = (this->super_Fl_Input_).mark_;
  }
  iVar2 = Fl_Input_::position(&this->super_Fl_Input_,p,iVar2);
  bVar1 = Fl::option(OPTION_ARROW_FOCUS);
  return (uint)!bVar1 + iVar2;
}

Assistant:

int Fl_Input::kf_move_eol() {
  return shift_position(line_end(position())) + NORMAL_INPUT_MOVE;
}